

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

BGwCI_sharedPtr __thiscall BayesianGameWithClusterInfo::Cluster(BayesianGameWithClusterInfo *this)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  undefined4 extraout_var;
  undefined1 (*pauVar4) [16];
  size_t sVar5;
  reference pvVar6;
  ulong uVar7;
  type pBVar8;
  undefined4 extraout_var_00;
  const_reference pvVar9;
  reference ppvVar10;
  reference ppTVar11;
  reference pvVar12;
  reference ppJVar13;
  value_type pJVar14;
  BayesianGameBase *pBVar15;
  undefined4 extraout_var_01;
  reference ppTVar16;
  shared_count extraout_RDX;
  BayesianGameForDecPOMDPStage *in_RSI;
  element_type *in_RDI;
  _Base_ptr p_Var17;
  _Base_ptr extraout_XMM0_Qa;
  BGwCI_sharedPtr BVar18;
  TypeCluster *tc_1;
  iterator last;
  iterator it;
  Index i;
  TypeClusterList *tcl_1;
  Index agI_2;
  double u;
  Index jaI;
  JointBeliefInterface *jbcopy;
  double p;
  Index previousjtcI;
  Index previousIndexOfThisTC;
  TypeCluster *tc;
  TypeClusterList *tcl;
  Index tcI;
  Index agI_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> previousTCI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes;
  Index jtcI;
  TypeClusterList *newTypeList;
  Index agI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrNewTypes;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  newTypeLists;
  BGwCI_sharedPtr *bgc;
  size_type in_stack_fffffffffffffd08;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd10;
  BayesianGameIdenticalPayoff *this_01;
  allocator_type *in_stack_fffffffffffffd18;
  allocator_type *__a;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffd24;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffd28;
  shared_ptr<BayesianGameWithClusterInfo> *in_stack_fffffffffffffd30;
  double in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  BayesianGameBase *in_stack_fffffffffffffd50;
  _Base_ptr in_stack_fffffffffffffd60;
  BayesianGameBase *in_stack_fffffffffffffd68;
  double in_stack_fffffffffffffd78;
  double in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  value_type vVar20;
  BGwCI_constPtr *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  QFunctionJAOHInterface *in_stack_fffffffffffffda0;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffda8;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdd0;
  BGClusterAlgorithm clusterAlg;
  undefined8 in_stack_fffffffffffffdd8;
  TypeClusterList *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffe70;
  __normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  local_100;
  Index local_f4;
  value_type local_f0;
  uint local_e4;
  _Base_ptr local_e0;
  uint local_d4;
  value_type local_d0;
  _Base_ptr local_c8;
  Index local_c0;
  Index local_bc;
  TypeCluster *local_b8;
  value_type local_b0;
  value_type local_a8;
  uint local_a4;
  undefined4 local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  uint local_78;
  undefined1 local_71;
  undefined1 (*local_70) [16];
  uint local_68;
  undefined8 local_60;
  allocator_type local_48 [64];
  
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            *)0x8bd978);
  (*(in_RSI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
    super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
    super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])
            (&in_RSI->super_BayesianGameIdenticalPayoff);
  local_60 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x8bd9bc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd30,
             (size_type)in_stack_fffffffffffffd28,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x8bd9f0);
  local_68 = 0;
  while( true ) {
    uVar7 = (ulong)local_68;
    iVar2 = (*(in_RSI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface
              .super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])
                      (&in_RSI->super_BayesianGameIdenticalPayoff);
    clusterAlg = (BGClusterAlgorithm)in_stack_fffffffffffffdd8;
    IVar3 = (Index)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    if (CONCAT44(extraout_var,iVar2) <= uVar7) break;
    pauVar4 = (undefined1 (*) [16])operator_new(0x18);
    *pauVar4 = (undefined1  [16])0x0;
    *(undefined8 *)pauVar4[1] = 0;
    std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::vector
              ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)0x8bda77);
    local_70 = pauVar4;
    std::
    vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
    ::push_back((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                (value_type *)in_stack_fffffffffffffd18);
    sVar5 = ConstructClusteredIndividualTypes
                      (in_stack_fffffffffffffe70,(Index)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       in_stack_fffffffffffffe60);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    *pvVar6 = sVar5;
    local_68 = local_68 + 1;
  }
  local_71 = 0;
  operator_new(0x1c8);
  BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete(in_RSI);
  BayesianGameForDecPOMDPStage::GetQHeur(in_RSI);
  BayesianGameForDecPOMDPStageInterface::GetStage
            (&in_RSI->super_BayesianGameForDecPOMDPStageInterface);
  this_00 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
            (in_RSI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
            super_BayesianGameBase._m_nrAgents;
  this_01 = (BayesianGameIdenticalPayoff *)
            &(in_RSI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
             super_BayesianGameBase._m_nrActions;
  uVar19 = *(undefined4 *)
            &in_RSI[1].super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
             super_BayesianGameBase._m_jTypeProbsSparse.data_.
             super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var17 = in_RSI[1].super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
            super_BayesianGameBase._m_jTypeProbsSparse.data_.
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __a = local_48;
  BayesianGameWithClusterInfo
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,IVar3,
             in_stack_fffffffffffffd90,
             (shared_ptr<const_JointPolicyDiscretePure> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),in_stack_fffffffffffffdc0
             ,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,clusterAlg,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
            ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::operator=((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               *)in_stack_fffffffffffffdb0,
              (vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               *)in_stack_fffffffffffffda8);
  local_78 = 0;
  while( true ) {
    uVar7 = (ulong)local_78;
    boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
              ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
    sVar5 = BayesianGameBase::GetNrJointTypes
                      ((BayesianGameBase *)CONCAT44(in_stack_fffffffffffffd24,uVar19));
    if (sVar5 <= uVar7) break;
    boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
              ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
    local_80 = BayesianGameBase::JointToIndividualTypeIndices
                         (in_stack_fffffffffffffd68,
                          (Index)((ulong)in_stack_fffffffffffffd60 >> 0x20));
    pBVar8 = boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                       ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
    (*(pBVar8->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
      super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[3])
              (&(pBVar8->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff);
    local_9c = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8bdd9b);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd30,
               (size_type)in_stack_fffffffffffffd28,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd24,uVar19),__a);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8bddcf);
    local_a4 = 0;
    while( true ) {
      uVar7 = (ulong)local_a4;
      pBVar8 = boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                         ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
      iVar2 = (*(pBVar8->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])
                        (&(pBVar8->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff);
      if (CONCAT44(extraout_var_00,iVar2) <= uVar7) break;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                          (size_type)this_00);
      local_a8 = *pvVar9;
      boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
      ppvVar10 = std::
                 vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                       *)this_01,(size_type)this_00);
      local_b0 = *ppvVar10;
      ppTVar11 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at
                           ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)this_01,
                            (size_type)this_00);
      local_b8 = *ppTVar11;
      IVar3 = TypeCluster::GetIndex(local_b8);
      local_bc = IVar3;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                           (size_type)this_00);
      *pvVar12 = IVar3;
      local_a4 = local_a4 + 1;
    }
    local_c0 = BayesianGameBase::IndividualToJointTypeIndices
                         ((BayesianGameBase *)this_01,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    (*(in_RSI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
      super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
      super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0xd])
              (&in_RSI->super_BayesianGameIdenticalPayoff,(ulong)local_c0);
    local_c8 = p_Var17;
    boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
              ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
    p_Var17 = local_c8;
    BayesianGameBase::SetProbability
              (in_stack_fffffffffffffd50,(Index)((ulong)in_stack_fffffffffffffd48 >> 0x20),
               in_stack_fffffffffffffd40);
    ppJVar13 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                         ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *
                          )this_01,(size_type)this_00);
    if (*ppJVar13 != (value_type)0x0) {
      ppJVar13 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                           ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                             *)this_01,(size_type)this_00);
      pJVar14 = (value_type)(**(code **)((long)**ppJVar13 + 0xb8))();
      p_Var17 = extraout_XMM0_Qa;
      local_d0 = pJVar14;
      boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
      ppJVar13 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                           ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                             *)this_01,(size_type)this_00);
      *ppJVar13 = pJVar14;
    }
    if (in_RSI[1].super_BayesianGameForDecPOMDPStageInterface._m_pJPol.px == (element_type *)0x0) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                           (size_type)this_00);
      vVar20 = *pvVar12;
      boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                           (size_type)this_00);
      *pvVar12 = vVar20;
    }
    local_d4 = 0;
    while( true ) {
      pBVar15 = (BayesianGameBase *)(ulong)local_d4;
      boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
      in_stack_fffffffffffffd68 =
           (BayesianGameBase *)
           BayesianGameBase::GetNrJointActions
                     ((BayesianGameBase *)CONCAT44(in_stack_fffffffffffffd24,uVar19));
      if (in_stack_fffffffffffffd68 <= pBVar15) break;
      (*(in_RSI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
        super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x10])
                (&in_RSI->super_BayesianGameIdenticalPayoff,(ulong)local_c0,(ulong)local_d4);
      in_stack_fffffffffffffd60 = p_Var17;
      local_e0 = p_Var17;
      boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
      p_Var17 = local_e0;
      BayesianGameIdenticalPayoff::SetUtility
                (this_01,(Index)((ulong)this_00 >> 0x20),(Index)this_00,4.52939967327373e-317);
      local_d4 = local_d4 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd24,uVar19));
    local_78 = local_78 + 1;
  }
  local_e4 = 0;
  while( true ) {
    uVar7 = (ulong)local_e4;
    iVar2 = (*(in_RSI->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface
              .super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])
                      (&in_RSI->super_BayesianGameIdenticalPayoff);
    if (CONCAT44(extraout_var_01,iVar2) <= uVar7) break;
    boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
              ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
    ppvVar10 = std::
               vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                     *)this_01,(size_type)this_00);
    local_f0 = *ppvVar10;
    local_f4 = 0;
    local_100._M_current =
         (TypeCluster **)std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::begin(this_00);
    std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                               *)this_01,
                              (__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                               *)this_00), bVar1) {
      ppTVar16 = __gnu_cxx::
                 __normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                 ::operator*(&local_100);
      TypeCluster::SetIndex(*ppTVar16,local_f4);
      local_f4 = local_f4 + 1;
      __gnu_cxx::
      __normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
      ::operator++((__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                    *)__a,(int)((ulong)this_01 >> 0x20));
    }
    local_e4 = local_e4 + 1;
  }
  pBVar8 = boost::shared_ptr<BayesianGameWithClusterInfo>::operator->
                     ((shared_ptr<BayesianGameWithClusterInfo> *)in_RDI);
  (*(pBVar8->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
    super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
    super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[0xf])
            (&(pBVar8->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff);
  local_71 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd24,uVar19));
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::~vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
             *)CONCAT44(in_stack_fffffffffffffd24,uVar19));
  BVar18.pn.pi_ = extraout_RDX.pi_;
  BVar18.px = in_RDI;
  return BVar18;
}

Assistant:

BGwCI_sharedPtr  
BayesianGameWithClusterInfo::Cluster() 
{
    //first construct new clustered individual type set for each agent
    std::vector< TypeClusterList* > newTypeLists;
    std::vector< size_t > nrNewTypes(GetNrAgents(), 0);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        //we create a new (empty) TypeClusterList for this agent.
        TypeClusterList* newTypeList = new TypeClusterList();
        newTypeLists.push_back(newTypeList);
        nrNewTypes.at(agI) = ConstructClusteredIndividualTypes(agI, 
                newTypeList);
    }

    BGwCI_sharedPtr bgc(new BayesianGameWithClusterInfo(
            GetPUDecPOMDPDiscrete(),
            GetQHeur(),
            GetStage(),
            _m_pBG,
            _m_pBGJPol,
            _m_nrAgents,
            _m_nrActions,
            nrNewTypes,
            _m_clusterAlgorithm,
            _m_thresholdJB,
            _m_thresholdPjaoh
                            ));

#if BGCLUSTER_OUTPUT_CLUSTERSTATS
    cout << GetStage() << " " << bgc->GetNrJointTypes()
         << "      stage " << GetStage()
         << " nrNewTypes " << SoftPrintVector(nrNewTypes)
         << " old nrJointTypes " << GetNrJointTypes()
         << " new nrJointTypes " << bgc->GetNrJointTypes()
         << endl;
#endif

    bgc->_m_typeLists = newTypeLists;


    //copy all the relevant stuff from the original BG (from *this*)
    //the the new clustered one (bgc)
    for(Index jtcI=0; jtcI < bgc->GetNrJointTypes(); jtcI++)
    {
        //find corresponding jtcI in the original BG (i.e., in this)
        const vector<Index>& indTypes = bgc->JointToIndividualTypeIndices(jtcI);
        vector<Index> previousTCI(bgc->GetNrAgents(), 0 );
        for(Index agI=0; agI < bgc->GetNrAgents(); agI++)
        {
            Index tcI = indTypes.at(agI);
            TypeClusterList* tcl = bgc->_m_typeLists.at(agI);
            TypeCluster* tc = tcl->at(tcI);
            Index previousIndexOfThisTC = tc->GetIndex();
            previousTCI.at(agI) = previousIndexOfThisTC;
        }
        Index previousjtcI = this->IndividualToJointTypeIndices(
                previousTCI);
        //
        double p = this->GetProbability(previousjtcI);
        bgc->SetProbability( jtcI, p);
        ///make a deep copy of the joint beliefs!
        //bgc->_m_JBs.at(jtcI) = this->_m_JBs.at(previousjtcI);
        if(this->_m_JBs.at(previousjtcI))
        {
            JointBeliefInterface* jbcopy =  (this->_m_JBs.at(previousjtcI))->Clone();
            bgc->_m_JBs.at(jtcI) = jbcopy;
        }

        // only maintain jaohRep if we are actually going to use them
        if(!_m_qJB)
            bgc->_m_jaohReps.at(jtcI) = this->_m_jaohReps.at(previousjtcI);

        for(Index jaI=0; jaI < bgc->GetNrJointActions(); jaI++)
        {
            double u = this->GetUtility(previousjtcI, jaI);
            bgc->SetUtility(jtcI, jaI, u);
        }

    }

    ///renumber the typeclusters for each agent
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {

        TypeClusterList* tcl = bgc->_m_typeLists.at(agI);
        Index i = 0;
        TypeClusterList::iterator it = tcl->begin();
        TypeClusterList::iterator last = tcl->end();
        while(it != last)
        {
            TypeCluster* tc = *it;
            tc->SetIndex(i);
            i++;
            it++;
        }
    }
      
    bgc->SanityCheck();
    

    return bgc;
    //return this;
}